

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall FIX::ScreenLog::~ScreenLog(ScreenLog *this)

{
  ScreenLog *this_local;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_0030c308;
  UtcTimeStamp::~UtcTimeStamp(&this->m_time);
  std::__cxx11::string::~string((string *)&this->m_prefix);
  Log::~Log(&this->super_Log);
  return;
}

Assistant:

ScreenLog( bool incoming, bool outgoing, bool event )
: m_prefix( "GLOBAL" ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}